

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.hpp
# Opt level: O0

void __thiscall PFData::PFData(PFData *this)

{
  string *in_RDI;
  allocator local_9 [9];
  
  std::__cxx11::string::string(in_RDI);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x50) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x58) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x60) = 0x3ff0000000000000;
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0x6c) = 1;
  *(undefined4 *)(in_RDI + 0x70) = 1;
  *(undefined4 *)(in_RDI + 0x74) = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI + 0x78,"zyx",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  in_RDI[0x98] = (string)0x0;
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  return;
}

Assistant:

PFData() = default;